

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

void __thiscall mpt::message_store::message_store(message_store *this,metatype *next)

{
  (this->super_reference<mpt::metatype>)._ref = next;
  (this->super_logger)._vptr_logger = (_func_int **)&PTR_log_00147af8;
  typed_array<mpt::message_store::entry>::typed_array(&this->_msg,-1);
  this->_act = 0;
  this->_flags = '\a';
  this->_ignore = '\x10';
  this->_level = '\0';
  return;
}

Assistant:

message_store::message_store(metatype *next) : reference<metatype>(next), _act(0), _flags(FlowNormal), _ignore(Debug), _level(0)
{ }